

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_mem.cc
# Opt level: O3

int mem_gets(BIO *bio,char *buf,int size)

{
  ulong uVar1;
  void *__s;
  int outl;
  uint uVar2;
  void *pvVar3;
  size_t __n;
  
  BIO_clear_retry_flags(bio);
  if (size < 1) {
    uVar2 = 0;
  }
  else {
    uVar1 = *bio->ptr;
    __n = uVar1 & 0xffffffff;
    if (size - 1U <= uVar1) {
      __n = (size_t)(size - 1U);
    }
    outl = (int)__n;
    if (outl == 0) {
      outl = 0;
    }
    else {
      __s = *(void **)((long)bio->ptr + 8);
      pvVar3 = memchr(__s,10,__n);
      if (pvVar3 != (void *)0x0) {
        outl = ((int)pvVar3 - (int)__s) + 1;
      }
    }
    uVar2 = mem_read(bio,buf,outl);
    if (-1 < (int)uVar2) {
      buf[uVar2] = '\0';
    }
  }
  return uVar2;
}

Assistant:

static int mem_gets(BIO *bio, char *buf, int size) {
  BIO_clear_retry_flags(bio);
  if (size <= 0) {
    return 0;
  }

  // The buffer size includes space for the trailing NUL, so we can read at most
  // one fewer byte.
  BUF_MEM *b = reinterpret_cast<BUF_MEM *>(bio->ptr);
  int ret = size - 1;
  if ((size_t)ret > b->length) {
    ret = (int)b->length;
  }

  // Stop at the first newline.
  const char *newline =
      reinterpret_cast<char *>(OPENSSL_memchr(b->data, '\n', ret));
  if (newline != NULL) {
    ret = (int)(newline - b->data + 1);
  }

  ret = mem_read(bio, buf, ret);
  if (ret >= 0) {
    buf[ret] = '\0';
  }
  return ret;
}